

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O0

void make_pair(stream_socket *s1,stream_socket *s2)

{
  endpoint *in_RDI;
  acceptor a;
  endpoint local_88 [15];
  allocator local_79;
  string local_78 [32];
  endpoint local_58 [24];
  acceptor local_40 [56];
  endpoint *local_8;
  
  local_8 = in_RDI;
  booster::aio::acceptor::acceptor(local_40);
  booster::aio::acceptor::open(local_40,1);
  booster::aio::basic_socket::set_option(local_40,2,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"127.0.0.1",&local_79);
  booster::aio::endpoint::endpoint(local_58,local_78,0);
  booster::aio::acceptor::bind((endpoint *)local_40);
  booster::aio::endpoint::~endpoint(local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  booster::aio::acceptor::listen((int)local_40);
  booster::aio::stream_socket::open(local_8,1);
  booster::aio::basic_socket::local_endpoint();
  booster::aio::stream_socket::connect(local_8);
  booster::aio::endpoint::~endpoint(local_88);
  booster::aio::acceptor::accept((stream_socket *)local_40);
  booster::aio::basic_io_device::close();
  booster::aio::acceptor::~acceptor(local_40);
  return;
}

Assistant:

void make_pair(io::stream_socket &s1,io::stream_socket &s2)
{
	io::acceptor a;
	a.open(io::pf_inet);
    #ifndef BOOSTER_WIN32
	a.set_option(io::stream_socket::reuse_address,true);
    #endif
	a.bind(io::endpoint("127.0.0.1",0));
	a.listen(1);
	s1.open(io::pf_inet);
	s1.connect(a.local_endpoint());
	a.accept(s2);
	a.close();
}